

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O2

void __thiscall
gl4cts::TextureFilterMinmaxUtils::Texture3D::generate
          (Texture3D *this,RenderContext *context,IVec3 *size,GLenum format,GLenum type,
          bool generateMipmaps)

{
  PtrData<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> data;
  long lVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  Texture3D *this_00;
  MovePtr<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *this_01;
  undefined1 in_stack_ffffffffffffff8c [12];
  UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> local_68;
  long local_50;
  Vec4 local_48;
  
  iVar2 = (*context->_vptr_RenderContext[3])(context);
  local_50 = CONCAT44(extraout_var,iVar2);
  this_00 = (Texture3D *)operator_new(0x70);
  iVar2 = size->m_data[2];
  glu::Texture3D::Texture3D(this_00,context,format,type,size->m_data[0],size->m_data[1],iVar2);
  local_68.m_data.ptr = (Texture3D *)0x0;
  this_01 = &this->m_texture;
  data._4_12_ = in_stack_ffffffffffffff8c;
  data.ptr._0_4_ = iVar2;
  de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::assignData
            (&this_01->super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>,data);
  de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::~UniqueBase
            (&local_68);
  tcu::Texture3D::allocLevel
            (&((this_01->super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>).
               m_data.ptr)->m_refTexture,0);
  lVar1 = local_50;
  dVar3 = (**(code **)(local_50 + 0x800))();
  glu::checkError(dVar3,"glu::Texture3D error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x19a);
  local_68.m_data.ptr = (Texture3D *)0x3f8000003f800000;
  local_68.m_data._8_8_ = 0x3f8000003f800000;
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 1.0;
  tcu::fillWithGrid((((this_01->
                      super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>).m_data.
                     ptr)->m_refTexture).super_TextureLevelPyramid.m_access.
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,4,(Vec4 *)&local_68,&local_48);
  dVar3 = (**(code **)(lVar1 + 0x800))();
  glu::checkError(dVar3,"glu::Texture3D error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x19e);
  glu::Texture3D::upload
            ((this_01->super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>).m_data
             .ptr);
  dVar3 = (**(code **)(lVar1 + 0x800))();
  glu::checkError(dVar3,"glu::Texture3D error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x1a1);
  (**(code **)(lVar1 + 8))(0x84c0);
  return;
}

Assistant:

void TextureFilterMinmaxUtils::Texture3D::generate(const glu::RenderContext& context, tcu::IVec3 size,
												   glw::GLenum format, glw::GLenum type, bool generateMipmaps)
{
	DE_UNREF(generateMipmaps);

	const glw::Functions& gl = context.getFunctions();

	m_texture = de::MovePtr<glu::Texture3D>(new glu::Texture3D(context, format, type, size.x(), size.y(), size.z()));

	m_texture->getRefTexture().allocLevel(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture3D error occurred");

	tcu::fillWithGrid(m_texture->getRefTexture().getLevel(0), 4, tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
					  tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture3D error occurred");

	m_texture->upload();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture3D error occurred");

	gl.activeTexture(GL_TEXTURE0);
}